

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O2

ssize_t __thiscall
QNativeSocketEngine::write(QNativeSocketEngine *this,int __fd,void *__buf,size_t __n)

{
  QNativeSocketEnginePrivate *this_00;
  char cVar1;
  qint64 qVar2;
  undefined4 in_register_00000034;
  char *pcVar3;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNativeSocketEnginePrivate **)(this + 8);
  cVar1 = (**(code **)(*(long *)this + 0x78))();
  if (cVar1 == '\0') {
    pcVar3 = "QNativeSocketEngine::write() was called on an uninitialized socket device";
  }
  else {
    if ((this_00->super_QAbstractSocketEnginePrivate).socketState == ConnectedState) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        qVar2 = QNativeSocketEnginePrivate::nativeWrite
                          (this_00,(char *)CONCAT44(in_register_00000034,__fd),(qint64)__buf);
        return qVar2;
      }
      goto LAB_001b91be;
    }
    pcVar3 = "QNativeSocketEngine::write() was not called in QAbstractSocket::ConnectedState";
  }
  local_28 = "default";
  local_40[0x14] = '\0';
  local_40[0x15] = '\0';
  local_40[0x16] = '\0';
  local_40[0x17] = '\0';
  local_40[0xc] = '\0';
  local_40[0xd] = '\0';
  local_40[0xe] = '\0';
  local_40[0xf] = '\0';
  local_40[0x10] = '\0';
  local_40[0x11] = '\0';
  local_40[0x12] = '\0';
  local_40[0x13] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_40[8] = '\0';
  local_40[9] = '\0';
  local_40[10] = '\0';
  local_40[0xb] = '\0';
  local_40[0] = '\x02';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  QMessageLogger::warning(local_40,pcVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return -1;
  }
LAB_001b91be:
  __stack_chk_fail();
}

Assistant:

qint64 QNativeSocketEngine::write(const char *data, qint64 size)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::write(), -1);
    Q_CHECK_STATE(QNativeSocketEngine::write(), QAbstractSocket::ConnectedState, -1);
    return d->nativeWrite(data, size);
}